

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O1

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::Check
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *object)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar6;
  RecyclableObject *prototype;
  Type TVar5;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x98,"(object)","object");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pTVar1 = (object->type).ptr;
  if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) != TypeFlagMask_None) {
    TVar5 = pTVar1->typeId;
    if (TVar5 == TypeIds_Null) {
      TVar5 = TypeIds_Null;
LAB_00b0afe8:
      bVar3 = false;
    }
    else {
      if (TVar5 == TypeIds_Proxy) {
        TVar5 = TypeIds_Undefined;
        goto LAB_00b0afe8;
      }
      bVar3 = true;
    }
    bVar4 = (byte)TVar5;
    if (!bVar3) goto LAB_00b0b01d;
  }
  bVar3 = RecyclableObject::HasOnlyWritableDataProperties(object);
  if (bVar3) {
    prototype = RecyclableObject::GetPrototype(object);
    bVar3 = CheckProtoChain(this,prototype);
    return bVar3;
  }
  bVar4 = 0;
LAB_00b0b01d:
  return (bool)(bVar4 & 1);
}

Assistant:

bool
PrototypeChainCache<T>::Check(_In_ RecyclableObject* object)
{
    Assert(object);
    if (object->GetType()->HasSpecialPrototype())
    {
        TypeId typeId = object->GetTypeId();
        if (typeId == TypeIds_Null)
        {
            return true;
        }
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
    }

    if (!T::CheckObject(object))
    {
        return false;
    }

    return CheckProtoChain(object->GetPrototype());
}